

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

bool __thiscall cmStateSnapshot::RaiseScope(cmStateSnapshot *this,string *var,char *varDef)

{
  PositionType *pPVar1;
  iterator *piVar2;
  StackIter begin;
  iterator other;
  StackIter end;
  bool bVar3;
  PointerType pSVar4;
  PointerType pSVar5;
  PointerType pcVar6;
  string_view local_90;
  cmLinkedTree<cmDefinitions> *local_80;
  PositionType local_78;
  cmLinkedTree<cmDefinitions> *local_70;
  PositionType local_68;
  string_view local_60;
  undefined1 local_50 [8];
  cmStateSnapshot parentDir;
  char *varDef_local;
  string *var_local;
  cmStateSnapshot *this_local;
  
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pPVar1 = &pSVar5->DirectoryParent;
  parentDir.Position.Position = (PositionType)pPVar1->Tree;
  other.Tree = pPVar1->Tree;
  other.Position = pPVar1->Position;
  bVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                    (&pSVar4->ScopeParent,other);
  if (bVar3) {
    GetBuildsystemDirectoryParent((cmStateSnapshot *)local_50,this);
    bVar3 = IsValid((cmStateSnapshot *)local_50);
    if (bVar3) {
      if (varDef == (char *)0x0) {
        RemoveDefinition((cmStateSnapshot *)local_50,var);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,varDef);
        SetDefinition((cmStateSnapshot *)local_50,var,local_60);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    local_70 = (pSVar4->Vars).Tree;
    local_68 = (pSVar4->Vars).Position;
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    piVar2 = &pSVar4->Root;
    local_80 = piVar2->Tree;
    local_78 = (pSVar4->Root).Position;
    end.Tree = piVar2->Tree;
    end.Position = piVar2->Position;
    begin.Position = local_68;
    begin.Tree = local_70;
    cmDefinitions::Raise(var,begin,end);
    if (varDef == (char *)0x0) {
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
      pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Parent);
      cmDefinitions::Unset(pcVar6,var);
    }
    else {
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
      pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Parent);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,varDef);
      cmDefinitions::Set(pcVar6,var,local_90);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmStateSnapshot::RaiseScope(std::string const& var, const char* varDef)
{
  if (this->Position->ScopeParent == this->Position->DirectoryParent) {
    cmStateSnapshot parentDir = this->GetBuildsystemDirectoryParent();
    if (!parentDir.IsValid()) {
      return false;
    }
    // Update the definition in the parent directory top scope.  This
    // directory's scope was initialized by the closure of the parent
    // scope, so we do not need to localize the definition first.
    if (varDef) {
      parentDir.SetDefinition(var, varDef);
    } else {
      parentDir.RemoveDefinition(var);
    }
    return true;
  }
  // First localize the definition in the current scope.
  cmDefinitions::Raise(var, this->Position->Vars, this->Position->Root);

  // Now update the definition in the parent scope.
  if (varDef) {
    this->Position->Parent->Set(var, varDef);
  } else {
    this->Position->Parent->Unset(var);
  }
  return true;
}